

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void readDQT(FILE *f)

{
  uchar uVar1;
  uint uVar2;
  int i;
  long lVar3;
  uchar t;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uchar s;
  uchar c;
  ulong local_48;
  uint local_3c;
  int local_38;
  uint local_34;
  
  uVar2 = EnterNewSection(f,"DQT");
  for (local_38 = uVar2 - 2; local_38 != 0; local_38 = local_38 + ~(local_3c << 3)) {
    fread(&c,1,1,(FILE *)f);
    uVar1 = c;
    uVar2 = (uint)(0xf < c) * 8 + 8;
    printf(anon_var_dwarf_2e8b,(ulong)uVar2);
    local_34 = uVar2 >> 3;
    local_48 = (ulong)(uVar1 & 0xf);
    local_3c = uVar2;
    printf(anon_var_dwarf_2ea2,local_48);
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      uVar4 = 0;
      uVar2 = local_34;
      while( true ) {
        bVar6 = uVar2 == 0;
        uVar2 = uVar2 - 1;
        if (bVar6) break;
        fread(&s,1,1,(FILE *)f);
        uVar4 = (uint)(byte)((char)uVar4 + s);
      }
      *(uint *)((long)quantTable[0] + lVar3 * 4 + (ulong)(uint)((int)local_48 << 9)) = uVar4;
    }
    local_48 = (ulong)(uint)((int)local_48 << 9);
    for (uVar5 = 0; uVar5 != 0x40; uVar5 = uVar5 + 1) {
      if ((uVar5 & 7) == 0) {
        putchar(10);
      }
      printf("%2d ",(ulong)*(uint *)((long)quantTable[0] + local_48 + uVar5 * 4));
    }
    putchar(10);
  }
  return;
}

Assistant:

void readDQT(FILE *f) {
    unsigned int len = EnterNewSection(f, "DQT");
    len -= 2;
    while (len > 0) {
        unsigned char c;
        fread(&c, 1, 1, f);
        len--;
        unsigned precision = c >> 4 == 0 ? 8 : 16;
        printf("精度：%d\n", precision);
        precision /= 8;
        unsigned char id = c & 0x0F;
        printf("量化表ID: %d\n", id);
        for (int i = 0; i < 64; i++) {
            unsigned char t = 0;
            for (int p = 0; p < precision; p++) {
                unsigned char s;
                fread(&s, 1, 1, f);
                t == t << 8;
                t += s;
            }
            quantTable[id][i] = t;
        }
        for (int i = 0; i < 64; i++) {
            if (i % 8 == 0) {
                printf("\n");
            }
            printf("%2d ", quantTable[id][i]);
        }
        printf("\n");
        len -= (precision*64);
    }
}